

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O3

void (anonymous_namespace)::print<Imf_3_2::MultiViewChannelName*>
               (MultiViewChannelName **begin,MultiViewChannelName **end)

{
  ostream *poVar1;
  MultiViewChannelName *pMVar2;
  MultiViewChannelName *pMVar3;
  int p;
  int iVar4;
  char local_3f [3];
  int local_3c;
  MultiViewChannelName **local_38;
  
  pMVar2 = *end;
  local_3c = 1;
  for (pMVar3 = *begin; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
    if (local_3c < pMVar3->part_number) {
      local_3c = pMVar3->part_number;
    }
  }
  iVar4 = 0;
  local_38 = begin;
  do {
    for (pMVar3 = *local_38; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
      if (pMVar3->part_number == iVar4) {
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
        local_3f[0] = ' ';
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3f,1);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(pMVar3->name)._M_dataplus._M_p,(pMVar3->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," in ",4);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(pMVar3->view)._M_dataplus._M_p,(pMVar3->view)._M_string_length);
        local_3f[1] = 0x20;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3f + 1,1);
        local_3f[2] = 0x20;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3f + 2,1);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(pMVar3->internal_name)._M_dataplus._M_p,
                            (pMVar3->internal_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        pMVar2 = *end;
      }
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != local_3c);
  return;
}

Assistant:

void
print (const T& begin, const T& end)
{
    int parts = 1;
    for (T i = begin; i != end; i++)
    {
        parts = max (i->part_number, parts);
    }

    for (int p = 0; p < parts; p++)
    {
        for (T i = begin; i != end; i++)
        {
            if (i->part_number == p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}